

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

void __thiscall cmake::SetGlobalGenerator(cmake *this,cmGlobalGenerator *gg)

{
  bool v;
  ulong uVar1;
  char *pcVar2;
  char *pcVar3;
  char *cc;
  char *cxx;
  allocator local_39;
  undefined1 local_38 [8];
  string env;
  cmGlobalGenerator *gg_local;
  cmake *this_local;
  
  env.field_2._8_8_ = gg;
  if (gg == (cmGlobalGenerator *)0x0) {
    cmSystemTools::Error
              ("Error SetGlobalGenerator called with null",(char *)0x0,(char *)0x0,(char *)0x0);
  }
  else {
    if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
      if (this->GlobalGenerator != (cmGlobalGenerator *)0x0) {
        (*this->GlobalGenerator->_vptr_cmGlobalGenerator[1])();
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)local_38,"CC=",&local_39);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_38,(string *)&this->CCEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_38);
      std::__cxx11::string::operator=((string *)local_38,"CXX=");
      uVar1 = std::__cxx11::string::empty();
      if ((uVar1 & 1) == 0) {
        std::__cxx11::string::operator+=((string *)local_38,(string *)&this->CXXEnvironment);
      }
      cmsys::SystemTools::PutEnv((string *)local_38);
      std::__cxx11::string::~string((string *)local_38);
    }
    this->GlobalGenerator = (cmGlobalGenerator *)env.field_2._8_8_;
    v = cmGlobalGenerator::GetForceUnixPaths(this->GlobalGenerator);
    cmSystemTools::SetForceUnixPaths(v);
    pcVar2 = getenv("CXX");
    pcVar3 = getenv("CC");
    if (pcVar2 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->CXXEnvironment,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->CXXEnvironment,pcVar2);
    }
    if (pcVar3 == (char *)0x0) {
      std::__cxx11::string::operator=((string *)&this->CCEnvironment,"");
    }
    else {
      std::__cxx11::string::operator=((string *)&this->CCEnvironment,pcVar3);
    }
  }
  return;
}

Assistant:

void cmake::SetGlobalGenerator(cmGlobalGenerator *gg)
{
  if(!gg)
    {
    cmSystemTools::Error("Error SetGlobalGenerator called with null");
    return;
    }
  // delete the old generator
  if (this->GlobalGenerator)
    {
    delete this->GlobalGenerator;
    // restore the original environment variables CXX and CC
    // Restore CC
    std::string env = "CC=";
    if(!this->CCEnvironment.empty())
      {
      env += this->CCEnvironment;
      }
    cmSystemTools::PutEnv(env);
    env = "CXX=";
    if(!this->CXXEnvironment.empty())
      {
      env += this->CXXEnvironment;
      }
    cmSystemTools::PutEnv(env);
    }

  // set the new
  this->GlobalGenerator = gg;

  // set the global flag for unix style paths on cmSystemTools as soon as
  // the generator is set.  This allows gmake to be used on windows.
  cmSystemTools::SetForceUnixPaths
    (this->GlobalGenerator->GetForceUnixPaths());

  // Save the environment variables CXX and CC
  const char* cxx = getenv("CXX");
  const char* cc = getenv("CC");
  if(cxx)
    {
    this->CXXEnvironment = cxx;
    }
  else
    {
    this->CXXEnvironment = "";
    }
  if(cc)
    {
    this->CCEnvironment = cc;
    }
  else
    {
    this->CCEnvironment = "";
    }
}